

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

TestSpec * Catch::parseTestSpec(TestSpec *__return_storage_ptr__,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar5;
  undefined4 extraout_var;
  TestSpecParser local_110;
  
  pSVar5 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar4 = (*(pSVar5->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[4])(pSVar5);
  local_110.m_tagAliases = (ITagAliasRegistry *)CONCAT44(extraout_var,iVar4);
  paVar1 = &local_110.m_arg.field_2;
  local_110.m_mode = None;
  local_110.lastMode = None;
  local_110.m_exclusion = false;
  local_110.m_pos = 0;
  local_110.m_realPatternPos = 0;
  local_110.m_arg._M_string_length = 0;
  local_110.m_arg.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_110.m_substring.field_2;
  local_110.m_substring._M_string_length = 0;
  local_110.m_substring.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_110.m_patternName.field_2;
  local_110.m_patternName._M_string_length = 0;
  local_110.m_patternName.field_2._M_local_buf[0] = '\0';
  local_110.m_escapeChars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.m_escapeChars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110.m_escapeChars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.m_currentFilter.m_patterns.
  super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.m_currentFilter.m_patterns.
  super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110.m_currentFilter.m_patterns.
  super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.m_testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.m_testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110.m_testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.m_testSpec.m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.m_testSpec.m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110.m_testSpec.m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.m_arg._M_dataplus._M_p = (pointer)paVar1;
  local_110.m_substring._M_dataplus._M_p = (pointer)paVar2;
  local_110.m_patternName._M_dataplus._M_p = (pointer)paVar3;
  TestSpecParser::parse(&local_110,arg);
  TestSpecParser::testSpec(__return_storage_ptr__,&local_110);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110.m_testSpec.m_invalidArgs);
  clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_110.m_testSpec.m_filters);
  clara::std::
  vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  ::~vector(&local_110.m_currentFilter.m_patterns);
  if (local_110.m_escapeChars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.m_escapeChars.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_patternName._M_dataplus._M_p != paVar3) {
    operator_delete(local_110.m_patternName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_substring._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.m_substring._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_arg._M_dataplus._M_p != paVar1) {
    operator_delete(local_110.m_arg._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

TestSpec parseTestSpec( std::string const& arg ) {
        return TestSpecParser( ITagAliasRegistry::get() ).parse( arg ).testSpec();
    }